

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O0

void anon_unknown.dwarf_167557::check(pbf_reader message)

{
  pbf_reader message_00;
  bool bVar1;
  pbf_tag_type pVar2;
  undefined8 in_stack_fffffffffffffe60;
  Decomposer local_162;
  ExprLhs<bool> local_161;
  StringRef local_160;
  SourceLineInfo local_150;
  StringRef local_140;
  undefined1 local_130 [8];
  AssertionHandler catchAssertionHandler_1;
  int local_d8;
  Decomposer local_d1;
  int *local_d0;
  BinaryExpr<const_int_&,_const_int_&> local_c8;
  StringRef local_98;
  SourceLineInfo local_88;
  StringRef local_78;
  undefined1 local_68 [8];
  AssertionHandler catchAssertionHandler;
  undefined8 local_18;
  undefined8 local_10;
  
  while (bVar1 = protozero::pbf_reader::next((pbf_reader *)&stack0x00000008), bVar1) {
    pVar2 = protozero::pbf_reader::tag((pbf_reader *)&stack0x00000008);
    if (pVar2 == 1) {
      protozero::pbf_reader::get_message
                ((pbf_reader *)&catchAssertionHandler.m_resultCapture,(pbf_reader *)&stack0x00000008
                );
      message_00.m_end = (char *)local_10;
      message_00.m_data = (char *)local_18;
      message_00.m_wire_type = (int)in_stack_fffffffffffffe60;
      message_00.m_tag = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      check_sub(message_00);
    }
    else if (pVar2 == 2) {
      local_78 = operator____catch_sr("REQUIRE",7);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
                 ,0x34);
      Catch::StringRef::StringRef(&local_98,"77 == message.get_int32()");
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)local_68,&local_78,&local_88,local_98,Normal);
      local_d8 = 0x4d;
      local_d0 = (int *)Catch::Decomposer::operator<=(&local_d1,&local_d8);
      catchAssertionHandler_1.m_resultCapture._0_4_ =
           protozero::pbf_reader::get_int32((pbf_reader *)&stack0x00000008);
      Catch::ExprLhs<int_const&>::operator==
                (&local_c8,(ExprLhs<int_const&> *)&local_d0,
                 (int *)&catchAssertionHandler_1.m_resultCapture);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)local_68,&local_c8.super_ITransientExpression);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr(&local_c8);
      Catch::AssertionHandler::complete((AssertionHandler *)local_68);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_68);
    }
    else {
      local_140 = operator____catch_sr("REQUIRE",7);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
                 ,0x38);
      Catch::StringRef::StringRef(&local_160,"false");
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)local_130,&local_140,&local_150,local_160,Normal);
      local_161 = Catch::Decomposer::operator<=(&local_162,false);
      Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_130,&local_161);
      Catch::AssertionHandler::complete((AssertionHandler *)local_130);
      Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_130);
    }
  }
  return;
}

Assistant:

void check(protozero::pbf_reader message) {
    while (message.next()) {
        switch (message.tag()) {
            case 1: {
                check_sub(message.get_message());
                break;
            }
            case 2: {
                REQUIRE(77 == message.get_int32());
                break;
            }
            default: {
                REQUIRE(false); // should never be here
                break;
            }
        }
    }
}